

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O3

void __thiscall
ddd::DaTrie<false,_false,_true>::delete_prefix_leaf(DaTrie<false,_false,_true> *this,Query *query)

{
  size_t sVar1;
  uint uVar2;
  
  uVar2 = SUB84((this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                super__Vector_impl_data._M_start[query->node_pos_],4);
  sVar1 = edge_size_(this,uVar2 & 0x7fffffff,2);
  unfix_(this,query->node_pos_,&this->blocks_);
  if (sVar1 == 1) {
    *(undefined4 *)
     ((this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
      super__Vector_impl_data._M_start + (uVar2 & 0x7fffffff)) = 0x7fffffff;
  }
  return;
}

Assistant:

void delete_prefix_leaf(Query& query) {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_leaf());
    assert(Prefix);

    auto parent_pos = bc_[query.node_pos()].check();
    auto edge_size = edge_size_(parent_pos, 2);
    assert(edge_size != 0);

    if (WithNLM) {
      delete_sib_(query.node_pos());
    }

    unfix_(query.node_pos(), blocks_);
    if (edge_size == 1) {
      bc_[parent_pos].set_base(INVALID_VALUE);
    }
  }